

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O0

xmlParserInputPtr testExternalEntityLoader(char *URL,char *ID,xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  xmlParserInputPtr pxVar3;
  char *pcVar4;
  int local_34;
  int memused;
  int i;
  xmlParserInputPtr ret;
  xmlParserCtxtPtr ctxt_local;
  char *ID_local;
  char *URL_local;
  
  local_34 = 0;
  while( true ) {
    if (nb_entities <= local_34) {
      iVar1 = checkTestFile(URL);
      if (iVar1 == 0) {
        iVar1 = xmlMemUsed();
        _memused = (xmlParserInputPtr)xmlNoNetExternalEntityLoader(URL,ID,ctxt);
        iVar2 = xmlMemUsed();
        extraMemoryFromResolver = (iVar2 - iVar1) + extraMemoryFromResolver;
      }
      else {
        _memused = (xmlParserInputPtr)xmlNoNetExternalEntityLoader(URL,ID,ctxt);
      }
      return _memused;
    }
    iVar1 = strcmp(testEntitiesName[local_34],URL);
    if (iVar1 == 0) break;
    local_34 = local_34 + 1;
  }
  pxVar3 = (xmlParserInputPtr)xmlNewStringInputStream(ctxt,testEntitiesValue[local_34]);
  if (pxVar3 == (xmlParserInputPtr)0x0) {
    return (xmlParserInputPtr)0x0;
  }
  pcVar4 = (char *)xmlStrdup(testEntitiesName[local_34]);
  pxVar3->filename = pcVar4;
  return pxVar3;
}

Assistant:

static xmlParserInputPtr
testExternalEntityLoader(const char *URL, const char *ID,
			 xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr ret;
    int i;

    for (i = 0;i < nb_entities;i++) {
        if (!strcmp(testEntitiesName[i], URL)) {
	    ret = xmlNewStringInputStream(ctxt,
	                (const xmlChar *) testEntitiesValue[i]);
	    if (ret != NULL) {
	        ret->filename = (const char *)
		                xmlStrdup((xmlChar *)testEntitiesName[i]);
	    }
	    return(ret);
	}
    }
    if (checkTestFile(URL)) {
	ret = xmlNoNetExternalEntityLoader(URL, ID, ctxt);
    } else {
	int memused = xmlMemUsed();
	ret = xmlNoNetExternalEntityLoader(URL, ID, ctxt);
	extraMemoryFromResolver += xmlMemUsed() - memused;
    }
#if 0
    if (ret == NULL) {
        fprintf(stderr, "Failed to find resource %s\n", URL);
    }
#endif

    return(ret);
}